

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O1

void __thiscall fasttext::Model::buildTree(Model *this,vector<long,_std::allocator<long>_> *counts)

{
  vector<fasttext::Node,_std::allocator<fasttext::Node>_> *this_00;
  pointer plVar1;
  pointer pNVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  pointer pNVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  int32_t j;
  uint uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [32];
  undefined1 in_ZMM3 [64];
  int32_t mini [2];
  vector<int,_std::allocator<int>_> path;
  vector<bool,_std::allocator<bool>_> local_88;
  int local_5c;
  undefined1 local_58 [16];
  int *local_48;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  *local_40;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_38;
  
  auVar23 = in_ZMM3._0_32_;
  this_00 = &this->tree;
  std::vector<fasttext::Node,_std::allocator<fasttext::Node>_>::resize
            (this_00,(long)this->osz_ * 2 - 1);
  uVar12 = this->osz_;
  lVar7 = (long)(int)uVar12;
  iVar4 = uVar12 * 2 + -1;
  if (0 < lVar7) {
    pNVar8 = (this_00->super__Vector_base<fasttext::Node,_std::allocator<fasttext::Node>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar9 = 1;
    if (1 < iVar4) {
      iVar9 = iVar4;
    }
    uVar11 = (ulong)(iVar9 + 7U & 0xfffffff8);
    auVar16 = vpbroadcastq_avx512f();
    auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar18 = vpbroadcastq_avx512f();
    auVar23 = vpcmpeqd_avx2(auVar23,auVar23);
    auVar19 = vpbroadcastq_avx512f(ZEXT816(1000000000000000));
    auVar20 = vpbroadcastq_avx512f(ZEXT816(8));
    do {
      uVar3 = vpcmpuq_avx512f(auVar17,auVar16,2);
      auVar21 = vpsllq_avx512f(auVar17,5);
      auVar22 = vpaddq_avx512f(auVar18,auVar21);
      vpscatterqd_avx512f(ZEXT832(pNVar8) + auVar21._0_32_,uVar3,auVar23);
      vpscatterqd_avx512f(ZEXT832(4) + auVar22._0_32_,uVar3,auVar23);
      vpscatterqd_avx512f(ZEXT832(8) + auVar22._0_32_,uVar3,auVar23);
      vpscatterqq_avx512f(ZEXT864(0x10) + auVar22,uVar3,auVar19);
      if ((uVar3 & 1) != 0) {
        *(undefined1 *)(auVar22._0_8_ + 0x18) = 0;
      }
      if ((uVar3 & 2) != 0) {
        lVar13 = vpextrq_avx(auVar22._0_16_,1);
        *(undefined1 *)(lVar13 + 0x18) = 0;
      }
      if ((uVar3 & 4) != 0) {
        *(undefined1 *)(auVar22._16_8_ + 0x18) = 0;
      }
      if ((uVar3 & 8) != 0) {
        lVar13 = vpextrq_avx(auVar22._16_16_,1);
        *(undefined1 *)(lVar13 + 0x18) = 0;
      }
      auVar15 = vextracti32x4_avx512f(auVar22,2);
      if ((uVar3 & 0x10) != 0) {
        *(undefined1 *)(auVar15._0_8_ + 0x18) = 0;
      }
      if ((uVar3 & 0x20) != 0) {
        lVar13 = vpextrq_avx(auVar15,1);
        *(undefined1 *)(lVar13 + 0x18) = 0;
      }
      auVar15 = vextracti32x4_avx512f(auVar22,3);
      if ((uVar3 & 0x40) != 0) {
        *(undefined1 *)(auVar15._0_8_ + 0x18) = 0;
      }
      if ((uVar3 & 0x80) != 0) {
        lVar13 = vpextrq_avx(auVar15,1);
        *(undefined1 *)(lVar13 + 0x18) = 0;
      }
      auVar17 = vpaddq_avx512f(auVar17,auVar20);
      uVar11 = uVar11 - 8;
    } while (uVar11 != 0);
  }
  if (0 < (int)uVar12) {
    plVar1 = (counts->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pNVar8 = (this_00->super__Vector_base<fasttext::Node,_std::allocator<fasttext::Node>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar13 = 0;
    do {
      *(undefined8 *)((long)&pNVar8->count + lVar13 * 4) = *(undefined8 *)((long)plVar1 + lVar13);
      lVar13 = lVar13 + 8;
    } while (lVar7 * 8 - lVar13 != 0);
  }
  if ((int)uVar12 < iVar4) {
    uVar10 = uVar12 - 1;
    pNVar8 = (this_00->super__Vector_base<fasttext::Node,_std::allocator<fasttext::Node>_>)._M_impl.
             super__Vector_impl_data._M_start;
    do {
      pNVar2 = (this_00->super__Vector_base<fasttext::Node,_std::allocator<fasttext::Node>_>).
               _M_impl.super__Vector_impl_data._M_start;
      lVar13 = 0;
      do {
        if (((int)uVar10 < 0) || (pNVar2[(int)uVar12].count <= pNVar2[uVar10].count)) {
          uVar5 = uVar10;
          uVar6 = uVar12 + 1;
          uVar14 = uVar12;
        }
        else {
          uVar5 = uVar10 - 1;
          uVar6 = uVar12;
          uVar14 = uVar10;
        }
        uVar12 = uVar6;
        uVar10 = uVar5;
        *(uint *)((long)&local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                 lVar13 * 4) = uVar14;
        lVar13 = lVar13 + 1;
      } while (lVar13 == 1);
      pNVar8[lVar7].left =
           (int)local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._M_p;
      lVar13 = (long)local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_;
      pNVar8[lVar7].right =
           local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p._4_4_;
      pNVar8[lVar7].count =
           pNVar8[lVar13].count +
           pNVar8[(int)local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p].count;
      pNVar8[(int)local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p].parent =
           (int32_t)lVar7;
      pNVar8[lVar13].parent = (int32_t)lVar7;
      pNVar8[lVar13].binary = true;
      lVar7 = lVar7 + 1;
    } while (lVar7 != iVar4);
  }
  if (0 < this->osz_) {
    local_38 = &this->paths;
    local_40 = &this->codes;
    lVar7 = 0;
    do {
      local_58 = (undefined1  [16])0x0;
      local_48 = (int *)0x0;
      local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_offset = 0;
      local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._M_offset = 0;
      local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
      pNVar8 = (this_00->super__Vector_base<fasttext::Node,_std::allocator<fasttext::Node>_>).
               _M_impl.super__Vector_impl_data._M_start;
      if (pNVar8[lVar7].parent != -1) {
        pNVar8 = pNVar8 + lVar7;
        lVar13 = lVar7;
        do {
          local_5c = pNVar8->parent - this->osz_;
          if ((int *)local_58._8_8_ == local_48) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      ((vector<int,_std::allocator<int>_> *)local_58,(iterator)local_58._8_8_,
                       &local_5c);
          }
          else {
            *(int *)local_58._8_8_ = local_5c;
            local_58._8_8_ = (int *)(local_58._8_8_ + 4);
          }
          std::vector<bool,_std::allocator<bool>_>::push_back
                    (&local_88,
                     (this_00->super__Vector_base<fasttext::Node,_std::allocator<fasttext::Node>_>).
                     _M_impl.super__Vector_impl_data._M_start[lVar13].binary);
          pNVar2 = (this_00->super__Vector_base<fasttext::Node,_std::allocator<fasttext::Node>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          lVar13 = (long)pNVar2[lVar13].parent;
          pNVar8 = pNVar2 + lVar13;
        } while (pNVar2[lVar13].parent != -1);
      }
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::push_back(local_38,(value_type *)local_58);
      std::
      vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
      ::push_back(local_40,&local_88);
      if (local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_offset = 0;
        local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_offset = 0;
        local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage = (_Bit_pointer)0x0;
      }
      if ((pointer)local_58._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_58._0_8_);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < this->osz_);
  }
  return;
}

Assistant:

void Model::buildTree(const std::vector<int64_t>& counts) {
	tree.resize(2 * osz_ - 1);
	for (int32_t i = 0; i < 2 * osz_ - 1; i++) {
		tree[i].parent = -1;
		tree[i].left = -1;
		tree[i].right = -1;
		tree[i].count = 1e15;
		tree[i].binary = false;
	}
	for (int32_t i = 0; i < osz_; i++) {
		tree[i].count = counts[i];
	}
	int32_t leaf = osz_ - 1;
	int32_t node = osz_;
	for (int32_t i = osz_; i < 2 * osz_ - 1; i++) {
		int32_t mini[2];
		for (int32_t j = 0; j < 2; j++) {
			if (leaf >= 0 && tree[leaf].count < tree[node].count) {
				mini[j] = leaf--;
			} else {
				mini[j] = node++;
			}
		}
		tree[i].left = mini[0];
		tree[i].right = mini[1];
		tree[i].count = tree[mini[0]].count + tree[mini[1]].count;
		tree[mini[0]].parent = i;
		tree[mini[1]].parent = i;
		tree[mini[1]].binary = true;
	}
	for (int32_t i = 0; i < osz_; i++) {
		std::vector<int32_t> path;
		std::vector<bool> code;
		int32_t j = i;
		while (tree[j].parent != -1) {
			path.push_back(tree[j].parent - osz_);
			code.push_back(tree[j].binary);
			j = tree[j].parent;
		}
		paths.push_back(path);
		codes.push_back(code);
	}
}